

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmCommonTargetGenerator::AppendOSXVerFlag
          (cmCommonTargetGenerator *this,string *flags,string *lang,char *name,bool so)

{
  cmLocalCommonGenerator *pcVar1;
  cmValue cVar2;
  ostream *poVar3;
  char *pcVar4;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  int patch;
  int minor;
  int major;
  string fallback_prop;
  string prop;
  string fvar;
  ostringstream vflag;
  int local_234;
  int local_230;
  int local_22c;
  string local_228;
  long *local_208 [2];
  long local_1f8 [2];
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [16];
  size_t local_198;
  char *local_190;
  undefined8 local_188;
  char *local_180;
  size_t local_178;
  char *local_170;
  undefined8 local_168;
  char *local_160;
  ios_base local_138 [264];
  
  local_190 = (lang->_M_dataplus)._M_p;
  local_198 = lang->_M_string_length;
  local_1a8._0_8_ = (_func_int **)0x6;
  local_1a8._8_8_ = "CMAKE_";
  local_188 = 5;
  local_180 = "_OSX_";
  local_178 = strlen(name);
  local_168 = 0xd;
  local_160 = "_VERSION_FLAG";
  views._M_len = 5;
  views._M_array = (iterator)local_1a8;
  local_170 = name;
  cmCatViews_abi_cxx11_(&local_1c8,views);
  cVar2 = cmMakefile::GetDefinition(this->Makefile,&local_1c8);
  if (cVar2.Value != (string *)0x0) {
    local_198 = strlen(name);
    local_1a8._0_8_ = (_func_int **)0x6;
    local_1a8._8_8_ = "MACHO_";
    local_188 = 8;
    local_180 = "_VERSION";
    views_00._M_len = 3;
    views_00._M_array = (iterator)local_1a8;
    local_190 = name;
    cmCatViews_abi_cxx11_(&local_1e8,views_00);
    pcVar4 = "VERSION";
    if (so) {
      pcVar4 = "SOVERSION";
    }
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_228,pcVar4,pcVar4 + (ulong)so * 2 + 7);
    cmGeneratorTarget::GetTargetVersionFallback
              (this->GeneratorTarget,&local_1e8,&local_228,&local_22c,&local_230,&local_234);
    if (((0 < local_22c) || (0 < local_230)) || (0 < local_234)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,((cVar2.Value)->_M_dataplus)._M_p,
                          (cVar2.Value)->_M_string_length);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_22c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,".",1);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_230);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,".",1);
      std::ostream::operator<<(poVar3,local_234);
      pcVar1 = this->LocalCommonGenerator;
      std::__cxx11::stringbuf::str();
      (*(pcVar1->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])(pcVar1,flags,local_208);
      if (local_208[0] != local_1f8) {
        operator_delete(local_208[0],local_1f8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmCommonTargetGenerator::AppendOSXVerFlag(std::string& flags,
                                               const std::string& lang,
                                               const char* name, bool so)
{
  // Lookup the flag to specify the version.
  std::string fvar = cmStrCat("CMAKE_", lang, "_OSX_", name, "_VERSION_FLAG");
  cmValue flag = this->Makefile->GetDefinition(fvar);

  // Skip if no such flag.
  if (!flag) {
    return;
  }

  // Lookup the target version information.
  int major;
  int minor;
  int patch;
  std::string prop = cmStrCat("MACHO_", name, "_VERSION");
  std::string fallback_prop = so ? "SOVERSION" : "VERSION";
  this->GeneratorTarget->GetTargetVersionFallback(prop, fallback_prop, major,
                                                  minor, patch);
  if (major > 0 || minor > 0 || patch > 0) {
    // Append the flag since a non-zero version is specified.
    std::ostringstream vflag;
    vflag << *flag << major << "." << minor << "." << patch;
    this->LocalCommonGenerator->AppendFlags(flags, vflag.str());
  }
}